

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O1

int checkloops(TTree *tree)

{
  int iVar1;
  
  while ((tree->tag != '\x05' || (iVar1 = checkaux(tree + 1,0), iVar1 == 0))) {
    if ((ulong)tree->tag == 0xd) {
      return 0;
    }
    if (""[tree->tag] == '\x02') {
      iVar1 = checkloops(tree + 1);
      if (iVar1 != 0) {
        return 1;
      }
      tree = tree + (tree->u).ps;
    }
    else {
      if (""[tree->tag] != '\x01') {
        return 0;
      }
      tree = tree + 1;
    }
  }
  return 1;
}

Assistant:

static int checkloops (TTree *tree) {
 tailcall:
  if (tree->tag == TRep && nullable(sib1(tree)))
    return 1;
  else if (tree->tag == TGrammar)
    return 0;  /* sub-grammars already checked */
  else {
    switch (numsiblings[tree->tag]) {
      case 1:  /* return checkloops(sib1(tree)); */
        tree = sib1(tree); goto tailcall;
      case 2:
        if (checkloops(sib1(tree))) return 1;
        /* else return checkloops(sib2(tree)); */
        tree = sib2(tree); goto tailcall;
      default: assert(numsiblings[tree->tag] == 0); return 0;
    }
  }
}